

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex.h
# Opt level: O2

void __thiscall
alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::
correct_traversal_path
          (Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false> *this,
          data_node_type *leaf,
          vector<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::TraversalNode,_std::allocator<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::TraversalNode>_>
          *traversal_path,bool left)

{
  pointer pTVar1;
  byte bVar2;
  uint uVar3;
  pointer pTVar4;
  pointer pTVar5;
  AlexNode<int,_int> **ppAVar6;
  self_type *psVar7;
  int iVar8;
  undefined7 in_register_00000009;
  int iVar9;
  model_node_type *pmVar10;
  model_node_type *node;
  TraversalNode local_30;
  
  pTVar4 = (traversal_path->
           super__Vector_base<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::TraversalNode,_std::allocator<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::TraversalNode>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  iVar9 = 1 << ((leaf->super_AlexNode<int,_int>).duplication_factor_ & 0x1f);
  pTVar1 = pTVar4 + -1;
  if ((int)CONCAT71(in_register_00000009,left) == 0) {
    pmVar10 = pTVar4[-1].node;
    iVar9 = (pTVar4[-1].bucketID - pTVar4[-1].bucketID % iVar9) + iVar9;
    iVar8 = iVar9;
    if (iVar9 == pmVar10->num_children_) {
      for (; iVar8 == iVar9; iVar8 = (pTVar4[-1].bucketID + iVar8) - pTVar4[-1].bucketID % iVar8) {
        pTVar5 = (traversal_path->
                 super__Vector_base<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::TraversalNode,_std::allocator<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::TraversalNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        (traversal_path->
        super__Vector_base<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::TraversalNode,_std::allocator<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::TraversalNode>_>
        )._M_impl.super__Vector_impl_data._M_finish = pTVar5 + -1;
        bVar2 = (pmVar10->super_AlexNode<int,_int>).duplication_factor_;
        pTVar4[-1].bucketID = pTVar5[-2].bucketID;
        iVar8 = 1 << (bVar2 & 0x1f);
        pTVar1->node = pTVar5[-2].node;
        pmVar10 = pTVar4[-1].node;
        iVar9 = pmVar10->num_children_;
      }
      pTVar4[-1].bucketID = iVar8;
      psVar7 = (self_type *)(pmVar10->children_ + iVar8);
      while (psVar7 = (self_type *)(psVar7->super_AlexNode<int,_int>)._vptr_AlexNode,
            (psVar7->super_AlexNode<int,_int>).is_leaf_ == false) {
        local_30.bucketID = 0;
        local_30.node = (model_node_type *)psVar7;
        std::
        vector<alex::Alex<int,int,alex::AlexCompare,std::allocator<std::pair<int,int>>,false>::TraversalNode,std::allocator<alex::Alex<int,int,alex::AlexCompare,std::allocator<std::pair<int,int>>,false>::TraversalNode>>
        ::
        emplace_back<alex::Alex<int,int,alex::AlexCompare,std::allocator<std::pair<int,int>>,false>::TraversalNode>
                  ((vector<alex::Alex<int,int,alex::AlexCompare,std::allocator<std::pair<int,int>>,false>::TraversalNode,std::allocator<alex::Alex<int,int,alex::AlexCompare,std::allocator<std::pair<int,int>>,false>::TraversalNode>>
                    *)traversal_path,&local_30);
        psVar7 = psVar7->next_leaf_;
      }
      if (psVar7 == leaf->next_leaf_) {
        return;
      }
      __assert_fail("cur == leaf->next_leaf_",
                    "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]ALEX/src/core/alex.h"
                    ,0x217,
                    "void alex::Alex<int, int, alex::AlexCompare, std::allocator<std::pair<int, int>>, false>::correct_traversal_path(data_node_type *, std::vector<TraversalNode> &, bool) const [T = int, P = int, Compare = alex::AlexCompare, Alloc = std::allocator<std::pair<int, int>>, allow_duplicates = false]"
                   );
    }
  }
  else {
    uVar3 = pTVar4[-1].bucketID;
    if (uVar3 == (int)uVar3 % iVar9) {
      iVar9 = 0;
      while (pmVar10 = pTVar1->node, iVar9 == 0) {
        pTVar5 = (traversal_path->
                 super__Vector_base<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::TraversalNode,_std::allocator<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::TraversalNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        (traversal_path->
        super__Vector_base<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::TraversalNode,_std::allocator<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::TraversalNode>_>
        )._M_impl.super__Vector_impl_data._M_finish = pTVar5 + -1;
        bVar2 = (pmVar10->super_AlexNode<int,_int>).duplication_factor_;
        pTVar4[-1].bucketID = pTVar5[-2].bucketID;
        pTVar1->node = pTVar5[-2].node;
        iVar9 = pTVar4[-1].bucketID - pTVar4[-1].bucketID % (1 << (bVar2 & 0x1f));
      }
      pTVar4[-1].bucketID = iVar9 + -1;
      ppAVar6 = pmVar10->children_ + (long)iVar9 + -1;
      while (psVar7 = (self_type *)*ppAVar6, (psVar7->super_AlexNode<int,_int>).is_leaf_ == false) {
        local_30.bucketID = *(int *)&psVar7->allocator_ + -1;
        local_30.node = (model_node_type *)psVar7;
        std::
        vector<alex::Alex<int,int,alex::AlexCompare,std::allocator<std::pair<int,int>>,false>::TraversalNode,std::allocator<alex::Alex<int,int,alex::AlexCompare,std::allocator<std::pair<int,int>>,false>::TraversalNode>>
        ::
        emplace_back<alex::Alex<int,int,alex::AlexCompare,std::allocator<std::pair<int,int>>,false>::TraversalNode>
                  ((vector<alex::Alex<int,int,alex::AlexCompare,std::allocator<std::pair<int,int>>,false>::TraversalNode,std::allocator<alex::Alex<int,int,alex::AlexCompare,std::allocator<std::pair<int,int>>,false>::TraversalNode>>
                    *)traversal_path,&local_30);
        ppAVar6 = (AlexNode<int,_int> **)
                  ((long)psVar7->next_leaf_ + (long)*(int *)&psVar7->allocator_ * 8 + -8);
      }
      if (psVar7 == leaf->prev_leaf_) {
        return;
      }
      __assert_fail("cur == leaf->prev_leaf_",
                    "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]ALEX/src/core/alex.h"
                    ,0x1fc,
                    "void alex::Alex<int, int, alex::AlexCompare, std::allocator<std::pair<int, int>>, false>::correct_traversal_path(data_node_type *, std::vector<TraversalNode> &, bool) const [T = int, P = int, Compare = alex::AlexCompare, Alloc = std::allocator<std::pair<int, int>>, allow_duplicates = false]"
                   );
    }
    iVar9 = uVar3 + ~((int)uVar3 % iVar9);
  }
  pTVar4[-1].bucketID = iVar9;
  return;
}

Assistant:

inline void correct_traversal_path(data_node_type* leaf,
                                     std::vector<TraversalNode>& traversal_path,
                                     bool left) const {
    if (left) {
      int repeats = 1 << leaf->duplication_factor_;
      TraversalNode& tn = traversal_path.back();
      model_node_type* parent = tn.node;
      // First bucket whose pointer is to leaf
      int start_bucketID = tn.bucketID - (tn.bucketID % repeats);
      if (start_bucketID == 0) {
        // Traverse back up the traversal path to make correction
        while (start_bucketID == 0) {
          traversal_path.pop_back();
          repeats = 1 << parent->duplication_factor_;
          tn = traversal_path.back();
          parent = tn.node;
          start_bucketID = tn.bucketID - (tn.bucketID % repeats);
        }
        int correct_bucketID = start_bucketID - 1;
        tn.bucketID = correct_bucketID;
        AlexNode<T, P>* cur = parent->children_[correct_bucketID];
        while (!cur->is_leaf_) {
          auto node = static_cast<model_node_type*>(cur);
          traversal_path.push_back({node, node->num_children_ - 1});
          cur = node->children_[node->num_children_ - 1];
        }
        assert(cur == leaf->prev_leaf_);
      } else {
        tn.bucketID = start_bucketID - 1;
      }
    } else {
      int repeats = 1 << leaf->duplication_factor_;
      TraversalNode& tn = traversal_path.back();
      model_node_type* parent = tn.node;
      // First bucket whose pointer is not to leaf
      int end_bucketID = tn.bucketID - (tn.bucketID % repeats) + repeats;
      if (end_bucketID == parent->num_children_) {
        // Traverse back up the traversal path to make correction
        while (end_bucketID == parent->num_children_) {
          traversal_path.pop_back();
          repeats = 1 << parent->duplication_factor_;
          tn = traversal_path.back();
          parent = tn.node;
          end_bucketID = tn.bucketID - (tn.bucketID % repeats) + repeats;
        }
        int correct_bucketID = end_bucketID;
        tn.bucketID = correct_bucketID;
        AlexNode<T, P>* cur = parent->children_[correct_bucketID];
        while (!cur->is_leaf_) {
          auto node = static_cast<model_node_type*>(cur);
          traversal_path.push_back({node, 0});
          cur = node->children_[0];
        }
        assert(cur == leaf->next_leaf_);
      } else {
        tn.bucketID = end_bucketID;
      }
    }
  }